

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_cfg_read(stb_cfg *z,char *key,void *value,int len)

{
  int iVar1;
  int local_40;
  int local_3c;
  int local_30;
  int n;
  int i;
  int len_local;
  void *value_local;
  char *key_local;
  stb_cfg *z_local;
  
  local_30 = 0;
  while( true ) {
    if (z->data == (stb__cfg_item *)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = *(int *)&z->data[-1].value;
    }
    if (local_3c <= local_30) break;
    iVar1 = strcasecmp(z->data[local_30].key,key);
    if (iVar1 == 0) {
      local_40 = len;
      if (z->data[local_30].value_len <= len) {
        local_40 = z->data[local_30].value_len;
      }
      memcpy(value,z->data[local_30].value,(long)local_40);
      if (local_40 < len) {
        *(undefined1 *)((long)value + (long)local_40) = 0;
      }
      return 1;
    }
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

int stb_cfg_read(stb_cfg *z, char *key, void *value, int len)
{
   int i;
   for (i=0; i < stb_arr_len(z->data); ++i) {
      if (!stb_stricmp(z->data[i].key, key)) {
         int n = stb_min(len, z->data[i].value_len);
         memcpy(value, z->data[i].value, n);
         if (n < len)
            *((char *) value + n) = 0;
         return 1;
      }
   }
   return 0;
}